

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void initialize_imputer<InputData<double,int>,double>
               (Imputer *imputer,InputData<double,_int> *input_data,size_t ntrees,int nthreads)

{
  vector<double,_std::allocator<double>_> *this;
  int iVar1;
  pointer pdVar2;
  double *pdVar3;
  int *piVar4;
  pointer puVar5;
  pointer pdVar6;
  long lVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  long lVar9;
  pointer puVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  size_t col;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  size_t col_1;
  size_t sVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cat_counts;
  allocator_type local_51;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  vector<int,_std::allocator<int>_> *local_38;
  
  imputer->ncols_numeric = input_data->ncols_numeric;
  sVar16 = input_data->ncols_categ;
  imputer->ncols_categ = sVar16;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
            ((vector<int,std::allocator<int>> *)&imputer->ncat,input_data->ncat,
             input_data->ncat + sVar16);
  this = &imputer->col_means;
  if ((imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_50._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              (this,input_data->ncols_numeric,(value_type_conflict *)&local_50);
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(this,input_data->ncols_numeric);
    pdVar2 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar6 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar6 != pdVar2; pdVar6 = pdVar6 + 1) {
      *pdVar6 = 0.0;
    }
  }
  local_38 = &imputer->col_modes;
  std::vector<int,_std::allocator<int>_>::resize(local_38,input_data->ncols_categ);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::vector((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            *)&local_50,ntrees,&local_51);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::_M_move_assign(&imputer->imputer_tree,&local_50);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             *)&local_50);
  pdVar3 = input_data->numeric_data;
  if (pdVar3 == (double *)0x0) {
    piVar4 = input_data->Xc_indptr;
    if (piVar4 != (int *)0x0) {
      uVar14 = 0;
      while (uVar14 < input_data->ncols_numeric) {
        sVar16 = input_data->nrows;
        pdVar3 = input_data->Xc;
        iVar1 = piVar4[uVar14 + 1];
        pdVar6 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar9 = (long)piVar4[uVar14]; lVar9 < iVar1; lVar9 = lVar9 + 1) {
          dVar20 = pdVar3[lVar9];
          if (0x7fefffffffffffff < (ulong)ABS(dVar20)) {
            dVar20 = 0.0;
          }
          pdVar6[uVar14] = dVar20 + pdVar6[uVar14];
          sVar16 = sVar16 - (0x7fefffffffffffff < (ulong)ABS(pdVar3[lVar9]));
        }
        auVar19._8_4_ = (int)(sVar16 >> 0x20);
        auVar19._0_8_ = sVar16;
        auVar19._12_4_ = 0x45300000;
        pdVar6 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar20 = NAN;
        if (sVar16 != 0) {
          dVar20 = pdVar6[uVar14] /
                   ((auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar16) - 4503599627370496.0));
        }
        pdVar6[uVar14] = dVar20;
        uVar14 = uVar14 + 1;
      }
    }
  }
  else {
    lVar9 = 0;
    for (uVar14 = 0; uVar14 < input_data->ncols_numeric; uVar14 = uVar14 + 1) {
      sVar16 = input_data->nrows;
      pdVar6 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar15 = sVar16;
      for (sVar17 = 0; sVar16 != sVar17; sVar17 = sVar17 + 1) {
        dVar20 = *(double *)((long)pdVar3 + sVar17 * 8 + sVar16 * lVar9);
        if (0x7fefffffffffffff < (ulong)ABS(dVar20)) {
          dVar20 = 0.0;
        }
        pdVar6[uVar14] = dVar20 + pdVar6[uVar14];
        sVar15 = sVar15 - (0x7fefffffffffffff <
                          (*(ulong *)((long)pdVar3 + sVar17 * 8 + sVar16 * lVar9) &
                          0x7fffffffffffffff));
      }
      auVar18._8_4_ = (int)(sVar15 >> 0x20);
      auVar18._0_8_ = sVar15;
      auVar18._12_4_ = 0x45300000;
      pdVar6 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar20 = NAN;
      if (sVar15 != 0) {
        dVar20 = pdVar6[uVar14] /
                 ((auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar15) - 4503599627370496.0));
      }
      pdVar6[uVar14] = dVar20;
      lVar9 = lVar9 + 8;
    }
  }
  if (input_data->categ_data != (int *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,
               (long)input_data->max_categ,(allocator_type *)&local_51);
    lVar9 = 0;
    for (uVar14 = 0; puVar5 = local_50._M_impl.super__Vector_impl_data._M_start,
        puVar10 = local_50._M_impl.super__Vector_impl_data._M_start,
        uVar14 < input_data->ncols_categ; uVar14 = uVar14 + 1) {
      for (; puVar10 != local_50._M_impl.super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
        *puVar10 = 0;
      }
      uVar11 = input_data->nrows;
      lVar7 = uVar11 * lVar9;
      piVar4 = input_data->categ_data;
      for (uVar12 = 0; uVar12 < uVar11; uVar12 = uVar12 + 1) {
        lVar13 = (long)*(int *)((long)piVar4 + uVar12 * 4 + lVar7);
        if (-1 < lVar13) {
          local_50._M_impl.super__Vector_impl_data._M_start[lVar13] =
               local_50._M_impl.super__Vector_impl_data._M_start[lVar13] + 1;
          uVar11 = input_data->nrows;
        }
      }
      _Var8 = std::
              __max_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_50._M_impl.super__Vector_impl_data._M_start,
                         local_50._M_impl.super__Vector_impl_data._M_start +
                         input_data->ncat[uVar14]);
      (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar14] = (int)((ulong)((long)_Var8._M_current - (long)puVar5) >> 3);
      lVar9 = lVar9 + 4;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_50);
  }
  return;
}

Assistant:

void initialize_imputer(Imputer &imputer, InputData &input_data, size_t ntrees, int nthreads)
{
    imputer.ncols_numeric  =  input_data.ncols_numeric;
    imputer.ncols_categ    =  input_data.ncols_categ;
    imputer.ncat.assign(input_data.ncat, input_data.ncat + input_data.ncols_categ);
    if (imputer.col_means.size())
    {
        imputer.col_means.resize(input_data.ncols_numeric);
        std::fill(imputer.col_means.begin(), imputer.col_means.end(), 0);
    }

    else
    {
        imputer.col_means.resize(input_data.ncols_numeric, 0);
    }

    imputer.col_modes.resize(input_data.ncols_categ);
    imputer.imputer_tree = std::vector<std::vector<ImputeNode>>(ntrees);

    /* TODO: here should use sample weights if specified as density */
    size_t offset, cnt;
    if (input_data.numeric_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) private(cnt, offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt    = input_data.nrows;
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.numeric_data[row + offset]))?
                                           input_data.numeric_data[row + offset] : 0;
                cnt -= is_na_or_inf(input_data.numeric_data[row + offset]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    else if (input_data.Xc_indptr != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) private(cnt) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt = input_data.nrows;
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.Xc[ix]))?
                                           input_data.Xc[ix] : 0;
                cnt -= is_na_or_inf(input_data.Xc[ix]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    if (input_data.categ_data != NULL)
    {
        std::vector<size_t> cat_counts(input_data.max_categ);
        #pragma omp parallel for schedule(static) num_threads(nthreads) firstprivate(cat_counts) private(offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_categ; col++)
        {
            std::fill(cat_counts.begin(), cat_counts.end(), 0);
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                if (input_data.categ_data[row + offset] >= 0)
                    cat_counts[input_data.categ_data[row + offset]]++;
            }
            imputer.col_modes[col] = (int) std::distance(cat_counts.begin(),
                                                         std::max_element(cat_counts.begin(),
                                                                           cat_counts.begin() + input_data.ncat[col]));
        }
    }
}